

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O1

void __thiscall
vkt::Draw::SubpassDescription::SubpassDescription
          (SubpassDescription *this,VkSubpassDescription *rhs)

{
  VkAttachmentReference *__first;
  pointer pVVar1;
  pointer puVar2;
  VkPipelineBindPoint VVar3;
  long lVar4;
  VkSubpassDescription *pVVar5;
  SubpassDescription *pSVar6;
  allocator_type local_51;
  void *local_50 [2];
  long local_40;
  vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_> *local_38;
  
  local_38 = &this->m_resolveAttachments;
  (this->m_preserveAttachments).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_preserveAttachments).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_resolveAttachments).
  super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_preserveAttachments).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_resolveAttachments).
  super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_resolveAttachments).
  super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_colorAttachments).
  super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_colorAttachments).
  super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_inputAttachments).
  super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_colorAttachments).
  super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_inputAttachments).
  super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_inputAttachments).
  super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pVVar5 = rhs;
  pSVar6 = this;
  for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
    VVar3 = pVVar5->pipelineBindPoint;
    (pSVar6->super_VkSubpassDescription).flags = pVVar5->flags;
    (pSVar6->super_VkSubpassDescription).pipelineBindPoint = VVar3;
    pVVar5 = (VkSubpassDescription *)&pVVar5->inputAttachmentCount;
    pSVar6 = (SubpassDescription *)&(pSVar6->super_VkSubpassDescription).inputAttachmentCount;
  }
  std::vector<vk::VkAttachmentReference,std::allocator<vk::VkAttachmentReference>>::
  vector<vk::VkAttachmentReference_const*,void>
            ((vector<vk::VkAttachmentReference,std::allocator<vk::VkAttachmentReference>> *)local_50
             ,rhs->pInputAttachments,rhs->pInputAttachments + rhs->inputAttachmentCount,&local_51);
  std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::_M_move_assign
            (&this->m_inputAttachments,local_50);
  if (local_50[0] != (void *)0x0) {
    operator_delete(local_50[0],local_40 - (long)local_50[0]);
  }
  std::vector<vk::VkAttachmentReference,std::allocator<vk::VkAttachmentReference>>::
  vector<vk::VkAttachmentReference_const*,void>
            ((vector<vk::VkAttachmentReference,std::allocator<vk::VkAttachmentReference>> *)local_50
             ,rhs->pColorAttachments,rhs->pColorAttachments + rhs->colorAttachmentCount,&local_51);
  std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::_M_move_assign
            (&this->m_colorAttachments,local_50);
  if (local_50[0] != (void *)0x0) {
    operator_delete(local_50[0],local_40 - (long)local_50[0]);
  }
  __first = rhs->pResolveAttachments;
  if (__first != (VkAttachmentReference *)0x0) {
    std::vector<vk::VkAttachmentReference,std::allocator<vk::VkAttachmentReference>>::
    vector<vk::VkAttachmentReference_const*,void>
              ((vector<vk::VkAttachmentReference,std::allocator<vk::VkAttachmentReference>> *)
               local_50,__first,__first + rhs->colorAttachmentCount,&local_51);
    std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::
    _M_move_assign(local_38,local_50);
    if (local_50[0] != (void *)0x0) {
      operator_delete(local_50[0],local_40 - (long)local_50[0]);
    }
  }
  std::vector<unsigned_int,std::allocator<unsigned_int>>::vector<unsigned_int_const*,void>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_50,rhs->pPreserveAttachments
             ,rhs->pPreserveAttachments + rhs->preserveAttachmentCount,(allocator_type *)&local_51);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            (&this->m_preserveAttachments,local_50);
  if (local_50[0] != (void *)0x0) {
    operator_delete(local_50[0],local_40 - (long)local_50[0]);
  }
  if (rhs->pDepthStencilAttachment != (VkAttachmentReference *)0x0) {
    this->m_depthStencilAttachment = *rhs->pDepthStencilAttachment;
  }
  pVVar1 = (this->m_inputAttachments).
           super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pVVar1 != (this->m_inputAttachments).
                super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    (this->super_VkSubpassDescription).pInputAttachments = pVVar1;
  }
  pVVar1 = (this->m_colorAttachments).
           super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pVVar1 != (this->m_colorAttachments).
                super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    (this->super_VkSubpassDescription).pColorAttachments = pVVar1;
  }
  pVVar1 = (this->m_resolveAttachments).
           super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pVVar1 != (this->m_resolveAttachments).
                super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    (this->super_VkSubpassDescription).pResolveAttachments = pVVar1;
  }
  (this->super_VkSubpassDescription).pDepthStencilAttachment = &this->m_depthStencilAttachment;
  puVar2 = (this->m_preserveAttachments).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (this->m_preserveAttachments).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    (this->super_VkSubpassDescription).pPreserveAttachments = puVar2;
  }
  return;
}

Assistant:

SubpassDescription::SubpassDescription (const vk::VkSubpassDescription& rhs)
{
	*static_cast<vk::VkSubpassDescription*>(this) = rhs;

	m_inputAttachments = std::vector<vk::VkAttachmentReference>(
		rhs.pInputAttachments, rhs.pInputAttachments + rhs.inputAttachmentCount);

	m_colorAttachments = std::vector<vk::VkAttachmentReference>(
		rhs.pColorAttachments, rhs.pColorAttachments + rhs.colorAttachmentCount);

	if (rhs.pResolveAttachments)
		m_resolveAttachments = std::vector<vk::VkAttachmentReference>(
			rhs.pResolveAttachments, rhs.pResolveAttachments + rhs.colorAttachmentCount);

	m_preserveAttachments = std::vector<deUint32>(
		rhs.pPreserveAttachments, rhs.pPreserveAttachments + rhs.preserveAttachmentCount);

	if (rhs.pDepthStencilAttachment)
		m_depthStencilAttachment = *rhs.pDepthStencilAttachment;

	if (!m_inputAttachments.empty())
		pInputAttachments = &m_inputAttachments[0];

	if (!m_colorAttachments.empty())
		pColorAttachments = &m_colorAttachments[0];

	if (!m_resolveAttachments.empty())
		pResolveAttachments = &m_resolveAttachments[0];

	pDepthStencilAttachment = &m_depthStencilAttachment;

	if (!m_preserveAttachments.empty())
		pPreserveAttachments = &m_preserveAttachments[0];
}